

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_post_error
                    (ma_context *pContext,ma_device *pDevice,ma_uint32 logLevel,char *message,
                    ma_result resultCode)

{
  ma_result mVar1;
  undefined8 in_RAX;
  ma_log_proc UNRECOVERED_JUMPTABLE;
  
  if (pDevice != (ma_device *)0x0 && pContext == (ma_context *)0x0) {
    pContext = pDevice->pContext;
  }
  UNRECOVERED_JUMPTABLE =
       (ma_log_proc)CONCAT71((int7)((ulong)in_RAX >> 8),pContext == (ma_context *)0x0);
  if ((logLevel < 2 && pContext != (ma_context *)0x0) &&
     (UNRECOVERED_JUMPTABLE = pContext->logCallback, UNRECOVERED_JUMPTABLE != (ma_log_proc)0x0)) {
    mVar1 = (*UNRECOVERED_JUMPTABLE)(pContext,pDevice,1,message);
    return mVar1;
  }
  return (ma_result)UNRECOVERED_JUMPTABLE;
}

Assistant:

static ma_result ma_context_post_error(ma_context* pContext, ma_device* pDevice, ma_uint32 logLevel, const char* message, ma_result resultCode)
{
    /* Derive the context from the device if necessary. */
    if (pContext == NULL) {
        if (pDevice != NULL) {
            pContext = pDevice->pContext;
        }
    }

    ma_post_log_message(pContext, pDevice, logLevel, message);
    return resultCode;
}